

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O3

AffineSpace3fa * __thiscall
embree::CoronaLoader::load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
          (AffineSpace3fa *__return_storage_ptr__,CoronaLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  undefined8 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  float fVar3;
  float fVar4;
  runtime_error *this_01;
  long *plVar5;
  long *plVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uStack_c0;
  ulong uStack_b0;
  ulong uStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  float local_78;
  float local_68;
  float local_58;
  string local_40;
  
  this_00 = (xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((long)(xml->ptr->body).super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x360) {
    fVar7 = Token::Float(this_00,true);
    fVar8 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 1,true);
    fVar9 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 2,true);
    fVar10 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 4,true);
    fVar11 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 5,true);
    local_58 = Token::Float((xml->ptr->body).
                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start + 6,true);
    local_68 = Token::Float((xml->ptr->body).
                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8,true);
    local_78 = Token::Float((xml->ptr->body).
                            super__Vector_base<embree::Token,_std::allocator<embree::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start + 9,true);
    fVar12 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 10,true);
    fVar4 = local_68;
    fVar3 = local_78;
    uVar1 = CONCAT44(local_58,fVar9);
    fVar9 = Token::Float((xml->ptr->body).
                         super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                         super__Vector_impl_data._M_start + 3,true);
    fVar13 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 7,true);
    fVar14 = Token::Float((xml->ptr->body).
                          super__Vector_base<embree::Token,_std::allocator<embree::Token>_>._M_impl.
                          super__Vector_impl_data._M_start + 0xb,true);
    uStack_a0 = (ulong)(uint)fVar4;
    *(ulong *)&(__return_storage_ptr__->l).vx.field_0 = CONCAT44(fVar10,fVar7);
    *(ulong *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uStack_a0;
    uStack_b0 = (ulong)(uint)fVar3;
    *(ulong *)&(__return_storage_ptr__->l).vy.field_0 = CONCAT44(fVar11,fVar8);
    *(ulong *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = uStack_b0;
    uStack_c0 = (ulong)(uint)fVar12;
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = uVar1;
    *(ulong *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uStack_c0;
    aVar2.m128[1] = fVar13;
    aVar2.m128[0] = fVar9;
    aVar2.m128[2] = fVar14;
    aVar2.m128[3] = 0.0;
    (__return_storage_ptr__->p).field_0 = aVar2;
    return __return_storage_ptr__;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_40,&xml->ptr->loc);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_98 = (long *)*plVar5;
  plVar6 = plVar5 + 2;
  if (local_98 == plVar6) {
    local_88 = *plVar6;
    lStack_80 = plVar5[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar6;
  }
  local_90 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_98);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AffineSpace3fa CoronaLoader::load<AffineSpace3fa>(const Ref<XML>& xml) 
  {
    if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
    return AffineSpace3fa(LinearSpace3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[ 2].Float(),
                                         xml->body[4].Float(),xml->body[5].Float(),xml->body[ 6].Float(),
                                         xml->body[8].Float(),xml->body[9].Float(),xml->body[10].Float()),
                          Vec3fa(xml->body[3].Float(),xml->body[7].Float(),xml->body[11].Float()));
  }